

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::TrimLeftRightHelper<true,false>
              (JavascriptString *arg,ScriptContext *scriptContext)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  char16 *pcVar4;
  JavascriptString *pJVar5;
  undefined4 *puVar6;
  charcount_t start;
  ulong uVar7;
  
  uVar1 = arg->m_charLength;
  pcVar4 = GetString(arg);
  if ((int)uVar1 < 1) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      bVar3 = IsWhiteSpaceCharacter(pcVar4[uVar7]);
      if (!bVar3) goto LAB_00d2d769;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    uVar7 = (ulong)uVar1;
  }
LAB_00d2d769:
  start = (charcount_t)uVar7;
  if (uVar1 == start) {
    pJVar5 = JavascriptLibrary::GetEmptyString
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    return pJVar5;
  }
  if (start != 0) {
    pJVar5 = SubString::New(arg,start,uVar1 - start);
    return pJVar5;
  }
  if ((((((arg->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr != scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x9f4,"(scriptContext == arg->GetScriptContext())",
                                "Should have already marshaled the string in cross site thunk");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return arg;
}

Assistant:

Var JavascriptString::TrimLeftRightHelper(JavascriptString* arg, ScriptContext* scriptContext)
    {
        static_assert(trimLeft || trimRight, "bad template instance of TrimLeftRightHelper()");

        int len = arg->GetLength();
        const char16 *string = arg->GetString();

        int idxStart = 0;
        if (trimLeft)
        {
            for (; idxStart < len; idxStart++)
            {
                char16 ch = string[idxStart];
                if (IsWhiteSpaceCharacter(ch))
                {
                    continue;
                }
                break;
            }

            if (len == idxStart)
            {
                return (scriptContext->GetLibrary()->GetEmptyString());
            }
        }

        int idxEnd = len - 1;
        if (trimRight)
        {
            for (; idxEnd >= 0; idxEnd--)
            {
                char16 ch = string[idxEnd];
                if (IsWhiteSpaceCharacter(ch))
                {
                    continue;
                }
                break;
            }

            if (!trimLeft)
            {
                if (idxEnd < 0)
                {
                    Assert(idxEnd == -1);
                    return (scriptContext->GetLibrary()->GetEmptyString());
                }
            }
            else
            {
                Assert(idxEnd >= 0);
            }
        }

        if (idxStart == 0 && idxEnd == len - 1)
        {
            AssertMsg(scriptContext == arg->GetScriptContext(), "Should have already marshaled the string in cross site thunk");
            return arg;
        }

        return SubstringCore(arg, idxStart, idxEnd - idxStart + 1, scriptContext);
    }